

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double_sprintf<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec,basic_buffer<char> *buffer)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char_type format [10];
  char local_42 [10];
  double local_38;
  
  local_38 = value;
  if (buffer->capacity_ == 0) {
    __assert_fail("(buffer.capacity() != 0) && \"empty buffer\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                  ,0xb6e,
                  "void fmt::basic_writer<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>::write_double_sprintf(T, const format_specs &, internal::basic_buffer<char_type> &) [Range = fmt::back_insert_range<fmt::internal::basic_buffer<char>>, T = double]"
                 );
  }
  local_42[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pcVar4 = local_42 + 1;
  }
  else {
    pcVar4 = local_42 + 2;
    local_42[1] = 0x23;
  }
  if (-1 < spec->precision_) {
    pcVar4[0] = '.';
    pcVar4[1] = '*';
    pcVar4 = pcVar4 + 2;
  }
  *pcVar4 = spec->type_;
  pcVar4[1] = '\0';
  do {
    uVar3 = internal::char_traits<char>::format_float<double>
                      (buffer->ptr_,buffer->capacity_,local_42,spec->precision_,local_38);
    if ((int)uVar3 < 0) {
      if (buffer->capacity_ != 0xffffffffffffffff) {
        (**buffer->_vptr_basic_buffer)(buffer,buffer->capacity_ + 1);
      }
LAB_0011f93e:
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      uVar1 = buffer->capacity_;
      if (uVar5 < uVar1) {
        buffer->size_ = uVar5;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        if (uVar1 < uVar3 + 1) {
          (**buffer->_vptr_basic_buffer)(buffer,(ulong)(uVar3 + 1));
        }
      }
      if (uVar1 <= uVar5) goto LAB_0011f93e;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void basic_writer<Range>::write_double_sprintf(
    T value, const format_specs &spec,
    internal::basic_buffer<char_type>& buffer) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buffer.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char_type format[MAX_FORMAT_SIZE];
  char_type *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = spec.type();
  *format_ptr = '\0';

  // Format using snprintf.
  char_type *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer.capacity();
    start = &buffer[0];
    int result = internal::char_traits<char_type>::format_float(
        start, buffer_size, format, spec.precision(), value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buffer.capacity()) {
        buffer.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buffer.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer.reserve(buffer.capacity() + 1);
    }
  }
}